

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::ParseLoopPreserveNone
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcParseTableBase *table)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  char *p;
  MessageLite *pMVar3;
  bool bVar4;
  unsigned_short uVar5;
  uint32_t uVar6;
  TcParseTableBase *this;
  ulong uVar7;
  TailCallParseFunc p_Var8;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  char *local_78;
  MessageLite *local_70;
  char *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_88 = table + 1;
  local_80 = ctx;
  local_78 = ptr;
  local_70 = msg;
  while (bVar4 = ParseContext::Done(local_80,&local_78), pMVar3 = local_70, p = local_78,
        pPVar2 = local_80, ((bVar4 ^ 0xffU) & 1) != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&msg_local);
    pTVar1 = local_88;
    this = local_88 + -1;
    uVar5 = UnalignedLoad<unsigned_short>(p);
    uVar7 = (ulong)(int)((uint)uVar5 & (uint)pTVar1[-1].fast_idx_mask);
    if ((uVar7 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   TcParseTableBase::fast_entry(this,uVar7 >> 3);
    local_58.data =
         (ulong)uVar5 ^
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data.field_0 + 8))->data;
    p_Var8 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data.field_0);
    local_60.data = local_58.data;
    local_78 = (*p_Var8)(pMVar3,p,pPVar2,(TcFieldData)local_58,this,0);
    if ((local_78 == (char *)0x0) ||
       (uVar6 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar6 != 1))
    break;
  }
  if ((local_88[-1].field_0x9 & 1) == 0) {
    local_68 = local_78;
  }
  else {
    pTVar1 = local_88 + -1;
    local_88 = local_88 + -1;
    local_68 = (*pTVar1->post_loop_handler)(local_70,local_78,local_80);
  }
  return local_68;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::ParseLoopPreserveNone(
    MessageLite* msg, const char* ptr, ParseContext* ctx,
    const TcParseTableBase* table) {
  return ParseLoop(msg, ptr, ctx, table);
}